

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O1

int secp256k1_der_read_len(uchar **sigp,uchar *sigend)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint uVar4;
  int iVar5;
  ulong uVar7;
  ulong uVar8;
  ulong uVar6;
  
  pbVar3 = *sigp;
  iVar5 = -1;
  if (pbVar3 < sigend) {
    pbVar1 = pbVar3 + 1;
    *sigp = pbVar1;
    bVar2 = *pbVar3;
    if (bVar2 != 0xff) {
      if (-1 < (char)bVar2) {
        return (uint)bVar2;
      }
      if (bVar2 != 0x80) {
        uVar4 = bVar2 & 0x7f;
        uVar6 = (ulong)uVar4;
        if ((((long)uVar6 <= (long)sigend - (long)pbVar1) && (uVar4 < 9)) && (*pbVar1 != 0)) {
          if ((bVar2 & 0x7f) == 0) {
            uVar7 = 0;
          }
          else {
            uVar8 = (long)sigend - (long)*sigp;
            uVar7 = 0;
            pbVar3 = *sigp;
            do {
              uVar7 = (ulong)*pbVar3 | uVar7 << 8;
              iVar5 = (int)uVar6;
              if (uVar8 < uVar6 + uVar7) {
                return -1;
              }
              *sigp = pbVar3 + 1;
              uVar8 = uVar8 - 1;
              uVar6 = (ulong)(iVar5 - 1);
              pbVar3 = pbVar3 + 1;
            } while (1 < iVar5);
          }
          iVar5 = -1;
          if (0x7f < uVar7) {
            iVar5 = (int)uVar7;
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

static int secp256k1_der_read_len(const unsigned char **sigp, const unsigned char *sigend) {
    int lenleft, b1;
    size_t ret = 0;
    if (*sigp >= sigend) {
        return -1;
    }
    b1 = *((*sigp)++);
    if (b1 == 0xFF) {
        /* X.690-0207 8.1.3.5.c the value 0xFF shall not be used. */
        return -1;
    }
    if ((b1 & 0x80) == 0) {
        /* X.690-0207 8.1.3.4 short form length octets */
        return b1;
    }
    if (b1 == 0x80) {
        /* Indefinite length is not allowed in DER. */
        return -1;
    }
    /* X.690-207 8.1.3.5 long form length octets */
    lenleft = b1 & 0x7F;
    if (lenleft > sigend - *sigp) {
        return -1;
    }
    if (**sigp == 0) {
        /* Not the shortest possible length encoding. */
        return -1;
    }
    if ((size_t)lenleft > sizeof(size_t)) {
        /* The resulting length would exceed the range of a size_t, so
         * certainly longer than the passed array size.
         */
        return -1;
    }
    while (lenleft > 0) {
        ret = (ret << 8) | **sigp;
        if (ret + lenleft > (size_t)(sigend - *sigp)) {
            /* Result exceeds the length of the passed array. */
            return -1;
        }
        (*sigp)++;
        lenleft--;
    }
    if (ret < 128) {
        /* Not the shortest possible length encoding. */
        return -1;
    }
    return ret;
}